

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json.c
# Opt level: O2

char * uo_json_decode_utf8(char *dst,char *src,size_t src_len)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  undefined8 in_RAX;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  int codepoint;
  undefined8 uStack_38;
  
  if (((src_len < 2) || (*src != '\"')) || (pbVar5 = (byte *)(src + (src_len - 1)), *pbVar5 != 0x22)
     ) {
LAB_0010864c:
    pbVar4 = (byte *)0x0;
  }
  else {
    pbVar6 = (byte *)(src + 1);
    uStack_38 = in_RAX;
LAB_001084a9:
    while (pbVar4 = (byte *)dst, pbVar6 < pbVar5) {
      if (*pbVar6 == 0x5c) {
        if (pbVar5 <= pbVar6 + 1) {
          return (char *)0x0;
        }
        pbVar1 = pbVar6 + 2;
        bVar2 = pbVar6[1];
        pbVar4 = (byte *)0x0;
        switch(bVar2) {
        case 0x6e:
          *dst = 10;
          break;
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x73:
          goto switchD_00108521_caseD_6f;
        case 0x72:
          *dst = 0xd;
          break;
        case 0x74:
          *dst = 9;
          break;
        case 0x75:
          pbVar6 = pbVar6 + 6;
          if (pbVar5 < pbVar6) {
            return (char *)0x0;
          }
          iVar3 = __isoc99_sscanf(pbVar1,"%04x",(long)&uStack_38 + 4);
          if (iVar3 == 1) goto code_r0x00108552;
          goto LAB_0010864c;
        default:
          if (bVar2 == 0x66) {
            *dst = 0xc;
          }
          else if (bVar2 == 0x2f) {
            *dst = 0x2f;
          }
          else if (bVar2 == 0x5c) {
            *dst = 0x5c;
          }
          else if (bVar2 == 0x62) {
            *dst = 8;
          }
          else {
            if (bVar2 != 0x22) {
              return (char *)0x0;
            }
            *dst = 0x22;
          }
        }
        dst = (char *)((byte *)dst + 1);
        pbVar6 = pbVar1;
      }
      else {
        *dst = *pbVar6;
        dst = (char *)((byte *)dst + 1);
        pbVar6 = pbVar6 + 1;
      }
    }
  }
switchD_00108521_caseD_6f:
  return (char *)pbVar4;
code_r0x00108552:
  bVar2 = (byte)((ulong)uStack_38 >> 0x20);
  if (uStack_38._4_4_ < 0x80) {
    *dst = bVar2;
    dst = (char *)((byte *)dst + 1);
  }
  else if (uStack_38._4_4_ < 0x800) {
    *dst = (byte)(uStack_38._4_4_ >> 6) | 0xc0;
    ((byte *)dst)[1] = bVar2 & 0x3f | 0x80;
    dst = (char *)((byte *)dst + 2);
  }
  else if (uStack_38._4_4_ < 0x10000) {
    *dst = (byte)(uStack_38._4_4_ >> 0xc) | 0xe0;
    ((byte *)dst)[1] = (byte)(uStack_38._4_4_ >> 6) & 0x3f | 0x80;
    ((byte *)dst)[2] = bVar2 & 0x3f | 0x80;
    dst = (char *)((byte *)dst + 3);
  }
  else if (uStack_38._4_4_ < 0x110000) {
    *dst = (byte)(uStack_38._4_4_ >> 0x12) | 0xf0;
    ((byte *)dst)[1] = (byte)(uStack_38._4_4_ >> 0xc) & 0x3f | 0x80;
    ((byte *)dst)[2] = (byte)(uStack_38._4_4_ >> 6) & 0x3f | 0x80;
    ((byte *)dst)[3] = bVar2 & 0x3f | 0x80;
    dst = (char *)((byte *)dst + 4);
  }
  else {
    dst = (char *)0x0;
  }
  goto LAB_001084a9;
}

Assistant:

char *uo_json_decode_utf8(
    char *dst,
    const char *src,
    size_t src_len)
{
    const char *json_end = src + src_len - 1;
    unsigned char c;

    if (src_len < 2 || *src++ != '\"' || *json_end != '\"')
        return NULL;

    while (src < json_end)
    {
        if ((c = *src++) == '\\')
        {
            if (src >= json_end)
                return NULL;

            switch (*src++)
            {
                case '"':  *dst++ = '"';  break;
                case '\\': *dst++ = '\\'; break;
                case '/':  *dst++ = '/';  break;
                case 'b':  *dst++ = '\b'; break;
                case 'f':  *dst++ = '\f'; break;
                case 'n':  *dst++ = '\n'; break;
                case 'r':  *dst++ = '\r'; break;
                case 't':  *dst++ = '\t'; break;
                
                case 'u':
                {
                    if (src + 4 > json_end)
                        return NULL;

                    int codepoint;
                    if (sscanf(src, "%04x", &codepoint) != 1)
                        return NULL;

                    src += 4;

                    dst = uo_utf8_append(dst, codepoint);
                    break;
                }

                default: return NULL;
            }
            continue;
        }

        *dst++ = c;
    }

    return dst;
}